

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O2

void t1_dec_clnpass_step(opj_t1_t *t1,flag_t *flagsp,int *datap,int orient,int oneplushalf)

{
  char cVar1;
  ushort uVar2;
  opj_mqc_t *mqc;
  int iVar3;
  uint uVar4;
  uint uVar5;
  
  uVar2 = *flagsp;
  if ((uVar2 & 0x5000) == 0) {
    mqc = t1->mqc;
    mqc->curctx = mqc->ctxs + ""[(long)(orient << 8) | (ulong)uVar2 & 0xff];
    iVar3 = mqc_decode(mqc);
    if (iVar3 != 0) {
      uVar5 = uVar2 >> 4 & 0xff;
      mqc->curctx = mqc->ctxs +
                    "\t\n\f\r\n\n\r\r\f\r\f\r\r\r\r\r\t\n\f\v\n\t\r\f\f\v\f\v\r\f\r\f\t\n\f\v\n\n\v\v\f\r\t\n\r\r\n\n\t\n\f\r\n\t\v\f\f\v\t\n\r\f\n\t\t\n\f\r\n\t\v\f\f\r\f\r\v\f\v\f\t\n\f\v\n\n\v\v\f\v\f\v\v\v\v\v\t\n\f\v\n\t\r\f\f\r\t\n\v\f\n\t\t\n\f\r\n\n\r\r\f\v\t\n\v\v\n\n\t\n\f\r\n\n\r\r\f\v\t\n\v\v\n\n\t\n\f\v\n\t\r\f\f\r\t\n\v\f\n\t\t\n\f\v\n\n\v\v\f\v\f\v\v\v\v\v\t\n\f\r\n\t\v\f\f\r\f\r\v\f\v\f\t\n\f\r\n\t\v\f\f\v\t\n\r\f\n\t\t\n\f\v\n\n\v\v\f\r\t\n\r\r\n\n\t\n\f\v\n\t\r\f\f\v\f\v\r\f\r\f\t\n\f\r\n\n\r\r\f\r\f\r\r\r\r\r"
                    [uVar5];
      uVar4 = mqc_decode(mqc);
      cVar1 = ""[uVar5];
      iVar3 = -oneplushalf;
      if (uVar4 == (int)cVar1) {
        iVar3 = oneplushalf;
      }
      *datap = iVar3;
      t1_updateflags(flagsp,uVar4 ^ (int)cVar1,t1->flags_stride);
    }
  }
  *(byte *)((long)flagsp + 1) = *(byte *)((long)flagsp + 1) & 0xbf;
  return;
}

Assistant:

static void t1_dec_clnpass_step(
		opj_t1_t *t1,
		flag_t *flagsp,
		int *datap,
		int orient,
		int oneplushalf)
{
	int v, flag;
	
	opj_mqc_t *mqc = t1->mqc;	/* MQC component */
	
	flag = *flagsp;
	if (!(flag & (T1_SIG | T1_VISIT))) {
		mqc_setcurctx(mqc, t1_getctxno_zc(flag, orient));
		if (mqc_decode(mqc)) {
			mqc_setcurctx(mqc, t1_getctxno_sc(flag));
			v = mqc_decode(mqc) ^ t1_getspb(flag);
			*datap = v ? -oneplushalf : oneplushalf;
			t1_updateflags(flagsp, v, t1->flags_stride);
		}
	}
	*flagsp &= ~T1_VISIT;
}